

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq_test.c
# Opt level: O0

void test_xreq_recv_header(void)

{
  nng_msg *msg;
  nng_err nVar1;
  int iVar2;
  uint32_t v;
  char *pcVar3;
  size_t sVar4;
  nng_err result__18;
  nng_err result__17;
  nng_err result__16;
  nng_err result__15;
  nng_err result__14;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  uint32_t id;
  nng_pipe p2;
  nng_pipe p1;
  nng_msg *m;
  nng_socket req;
  nng_socket rep;
  
  nVar1 = nng_rep0_open_raw((nng_socket *)((long)&m + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xf8,"%s: expected success, got %s (%d)","nng_rep0_open_raw(&rep)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_req0_open_raw((nng_socket *)&m);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xf9,"%s: expected success, got %s (%d)","nng_req0_open_raw(&req)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(m._0_4_,"recv-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xfa,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(m._0_4_,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xfb,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(m._4_4_,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xfc,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(m._4_4_,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xfd,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry_ex(m._0_4_,m._4_4_,(char *)0x0,(nng_pipe *)&id,(nng_pipe *)&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0xff,"%s: expected success, got %s (%d)",
                         "nuts_marry_ex(req, rep, ((void*)0), &p1, &p2)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_alloc((nng_msg **)&p2,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x102,"%s: expected success, got %s (%d)","nng_msg_alloc(&m, 0)",pcVar3,
                         nVar1);
  msg = _p2;
  if (iVar2 == 0) {
    acutest_abort_();
  }
  v = nng_pipe_id((nng_pipe)result_);
  nVar1 = nng_msg_header_append_u32(msg,v);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x103,"%s: expected success, got %s (%d)",
                         "nng_msg_header_append_u32(m, nng_pipe_id(p2))",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_append_u32(_p2,2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x104,"%s: expected success, got %s (%d)",
                         "nng_msg_header_append_u32(m, 0x2)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_append_u32(_p2,1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x105,"%s: expected success, got %s (%d)",
                         "nng_msg_header_append_u32(m, 0x1)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_append_u32(_p2,0x80000123);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x106,"%s: expected success, got %s (%d)",
                         "nng_msg_header_append_u32(m, 0x80000123u)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sendmsg(m._4_4_,_p2,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x108,"%s: expected success, got %s (%d)","nng_sendmsg(rep, m, 0)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_recvmsg(m._0_4_,(nng_msg **)&p2,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x10a,"%s: expected success, got %s (%d)","nng_recvmsg(req, &m, 0)",pcVar3
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  sVar4 = nng_msg_header_len(_p2);
  acutest_check_((uint)(sVar4 == 0xc),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x10b,"%s","nng_msg_header_len(m) == 12");
  nVar1 = nng_msg_header_trim_u32(_p2,&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x10c,"%s: expected success, got %s (%d)",
                         "nng_msg_header_trim_u32(m, &id)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(result__1 == NNG_ENOMEM),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x10d,"%s","id == 0x2");
  nVar1 = nng_msg_header_trim_u32(_p2,&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x10e,"%s: expected success, got %s (%d)",
                         "nng_msg_header_trim_u32(m, &id)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(result__1 == NNG_EINTR),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x10f,"%s","id == 0x1");
  nVar1 = nng_msg_header_trim_u32(_p2,&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x110,"%s: expected success, got %s (%d)",
                         "nng_msg_header_trim_u32(m, &id)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(result__1 == 0x80000123),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                 ,0x111,"%s","id == 0x80000123u");
  nng_msg_free(_p2);
  nVar1 = nng_socket_close(m._0_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x115,"%s: expected success, got %s (%d)","nng_socket_close(req)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close(m._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/xreq_test.c"
                         ,0x116,"%s: expected success, got %s (%d)","nng_socket_close(rep)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

static void
test_xreq_recv_header(void)
{
	nng_socket rep;
	nng_socket req;
	nng_msg   *m;
	nng_pipe   p1, p2;
	uint32_t   id;

	NUTS_PASS(nng_rep0_open_raw(&rep));
	NUTS_PASS(nng_req0_open_raw(&req));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(req, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(rep, NNG_OPT_SENDTIMEO, 1000));

	NUTS_MARRY_EX(req, rep, NULL, &p1, &p2);

	// Simulate a few hops.
	NUTS_PASS(nng_msg_alloc(&m, 0));
	NUTS_PASS(nng_msg_header_append_u32(m, nng_pipe_id(p2)));
	NUTS_PASS(nng_msg_header_append_u32(m, 0x2));
	NUTS_PASS(nng_msg_header_append_u32(m, 0x1));
	NUTS_PASS(nng_msg_header_append_u32(m, 0x80000123u));

	NUTS_PASS(nng_sendmsg(rep, m, 0));

	NUTS_PASS(nng_recvmsg(req, &m, 0));
	NUTS_TRUE(nng_msg_header_len(m) == 12);
	NUTS_PASS(nng_msg_header_trim_u32(m, &id));
	NUTS_TRUE(id == 0x2);
	NUTS_PASS(nng_msg_header_trim_u32(m, &id));
	NUTS_TRUE(id == 0x1);
	NUTS_PASS(nng_msg_header_trim_u32(m, &id));
	NUTS_TRUE(id == 0x80000123u);

	nng_msg_free(m);

	NUTS_CLOSE(req);
	NUTS_CLOSE(rep);
}